

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

void substitute_args(List *argval,List *argname,List *expr)

{
  TokenType TVar1;
  ListStruct *pLVar2;
  bool bVar3;
  BOOL BVar4;
  List *pLVar5;
  List *tmp_cdr;
  List *pLStack_38;
  BOOL has_tail;
  List *tail;
  List *val;
  List *name;
  List *expr_local;
  List *argname_local;
  List *argval_local;
  
  pLStack_38 = (List *)0x0;
  bVar3 = false;
  tail = argval;
  val = argname;
  do {
    name = expr;
    if (val == (List *)0x0) {
LAB_0010a661:
      do {
        if (name == (List *)0x0) {
          return;
        }
        TVar1 = (name->token).type;
        tail = argval;
        val = argname;
        if (TVar1 == TOK_IDENTIFIER) {
          for (; val != (List *)0x0 && tail != (List *)0x0; val = val->cdr) {
            if ((((val->token).type == TOK_IDENTIFIER) || ((val->token).type == TOK_TAIL)) &&
               (BVar4 = tokens_equal(&val->token,&name->token), BVar4 != FALSE)) {
              pLVar2 = name->cdr;
              memcpy(name,tail,0x30);
              pLVar5 = copy_list(tail->car);
              name->car = pLVar5;
              name->cdr = pLVar2;
              break;
            }
            tail = tail->cdr;
          }
        }
        else if (TVar1 == TOK_TAIL) {
          if (!bVar3) {
            parse_error(name,"But this macro has no tail!\n");
          }
          pLVar5 = copy_list(pLStack_38);
          replace_list(name,pLVar5);
        }
        else if (TVar1 == TOK_LIST) {
          substitute_args(argval,argname,name->car);
        }
        name = name->cdr;
      } while( true );
    }
    if ((val->token).type == TOK_TAIL) {
      pLStack_38 = tail;
      bVar3 = true;
      goto LAB_0010a661;
    }
    val = val->cdr;
    tail = tail->cdr;
  } while( true );
}

Assistant:

static void
substitute_args (const List *argval, const List *argname, List *expr)
{
  const List *name, *val, *tail = NULL;
  BOOL has_tail = FALSE;

#ifdef DEBUG
  List *original_expr = expr;

  printf ("substitute_args: ");
  printf ("argval  = ");   print_list (argval, stdout);
  printf ("\nargname = "); print_list (argname, stdout);
  printf ("\nexpr    = "); print_list (expr, stdout);
  putchar ('\n');
#endif

  /* See if there is a +tail, and make it tail point to the list of args. */
  for (name = argname, val = argval; name != NULL;
       name = name->cdr, val = val->cdr)
    if (name->token.type == TOK_TAIL)
      {
	tail = val;
	has_tail = TRUE;
	break;
      }


  for (; expr != NULL; expr = expr->cdr)
    {
      switch (expr->token.type) {
      case TOK_LIST:
	substitute_args (argval, argname, expr->car);
	break;
      case TOK_IDENTIFIER:
	for (name = argname, val = argval; name != NULL && val != NULL;
	     name = name->cdr, val = val->cdr)
	  if (!IS_LITERAL (name) && tokens_equal (&name->token, &expr->token))
	    {
	      List *tmp_cdr = expr->cdr;
	      *expr = *val;
	      expr->car = copy_list (val->car);
	      expr->cdr = tmp_cdr;
	      break;
	    }
	break;
      case TOK_TAIL:
	if (!has_tail)
	  parse_error (expr, "But this macro has no tail!\n");
	replace_list (expr, copy_list (tail));
	break;

      default: break;
      }
    }

#ifdef DEBUG
  printf ("*** expr after argument substitutions:\n");
  print_list (original_expr, stdout);
  putchar ('\n');
#endif

}